

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool google::anon_unknown_1::GetFromEnv<bool>(char *varname,char *type,bool dflt)

{
  bool bVar1;
  void *valbuf;
  char *value;
  undefined8 uVar2;
  undefined1 local_68 [8];
  FlagValue ifv;
  string local_48 [8];
  string valstr;
  bool dflt_local;
  char *type_local;
  char *varname_local;
  
  std::__cxx11::string::string(local_48);
  bVar1 = SafeGetEnv(varname,(string *)local_48);
  varname_local._7_1_ = dflt;
  if (bVar1) {
    valbuf = operator_new(1);
    FlagValue::FlagValue((FlagValue *)local_68,valbuf,type,true);
    value = (char *)std::__cxx11::string::c_str();
    bVar1 = FlagValue::ParseFrom((FlagValue *)local_68,value);
    if (!bVar1) {
      uVar2 = std::__cxx11::string::c_str();
      ReportError(DIE,"ERROR: error parsing env variable \'%s\' with value \'%s\'\n",varname,uVar2);
    }
    varname_local._7_1_ = *(byte *)local_68 & 1;
    FlagValue::~FlagValue((FlagValue *)local_68);
  }
  std::__cxx11::string::~string(local_48);
  return (bool)(varname_local._7_1_ & 1);
}

Assistant:

T GetFromEnv(const char *varname, const char* type, T dflt) {
  std::string valstr;
  if (SafeGetEnv(varname, valstr)) {
    FlagValue ifv(new T, type, true);
    if (!ifv.ParseFrom(valstr.c_str())) {
      ReportError(DIE, "ERROR: error parsing env variable '%s' with value '%s'\n",
                  varname, valstr.c_str());
	}
    return OTHER_VALUE_AS(ifv, T);
  } else return dflt;
}